

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient3dslow(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int elen;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double b;
  double b_00;
  double b_01;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double temp16 [16];
  double bdet [64];
  double adet [64];
  double temp32t [32];
  double temp32 [32];
  double cdet [64];
  double deter [192];
  double abdet [128];
  double local_1438;
  double local_1430;
  double dStack_1428;
  double local_1420;
  double dStack_1418;
  double local_1410;
  double dStack_1408;
  double local_1400;
  double local_13f8;
  double local_13f0;
  double dStack_13e8;
  double local_13e0;
  double dStack_13d8;
  double local_13d0;
  double dStack_13c8;
  double local_13c0;
  double local_13b8;
  double local_13b0;
  double dStack_13a8;
  double local_13a0;
  double dStack_1398;
  double local_1390;
  double dStack_1388;
  double local_1380;
  double local_1378;
  double local_1370;
  double dStack_1368;
  double local_1360;
  double dStack_1358;
  double local_1350;
  double dStack_1348;
  double local_1340;
  double local_1338;
  double local_1330;
  double dStack_1328;
  double local_1320;
  double dStack_1318;
  double local_1310;
  double dStack_1308;
  double local_1300;
  double local_12f8;
  double local_12f0;
  double dStack_12e8;
  double local_12e0;
  double dStack_12d8;
  double local_12d0;
  double dStack_12c8;
  double local_12c0;
  double local_12b8 [16];
  double local_1238 [64];
  double local_1038 [64];
  double local_e38 [32];
  double local_d38 [32];
  double local_c38 [63];
  double adStack_a40 [193];
  double local_438 [129];
  
  dVar8 = *pa;
  dVar1 = pa[2];
  dVar2 = pd[2];
  b = dVar1 - dVar2;
  dVar9 = *pb;
  dVar10 = pb[1];
  dVar3 = pb[2];
  b_00 = dVar3 - dVar2;
  dVar4 = pc[2];
  b_01 = dVar4 - dVar2;
  dVar11 = *pd;
  dVar12 = pd[1];
  dVar25 = dVar8 - dVar11;
  dVar23 = (dVar8 - (dVar25 + (dVar8 - dVar25))) + ((dVar8 - dVar25) - dVar11);
  dVar38 = dVar9 - dVar11;
  dVar39 = (dVar9 - (dVar38 + (dVar9 - dVar38))) + ((dVar9 - dVar38) - dVar11);
  dVar31 = dVar10 - dVar12;
  dVar27 = (dVar10 - (dVar31 + (dVar10 - dVar31))) + ((dVar10 - dVar31) - dVar12);
  dVar8 = pa[1];
  dVar9 = *pc;
  dVar17 = dVar8 - dVar12;
  dVar21 = dVar9 - dVar11;
  dVar28 = (dVar8 - (dVar17 + (dVar8 - dVar17))) + ((dVar8 - dVar17) - dVar12);
  dVar30 = (dVar9 - (dVar21 + (dVar9 - dVar21))) + ((dVar9 - dVar21) - dVar11);
  dVar8 = pc[1];
  dVar14 = dVar8 - dVar12;
  dVar18 = (dVar8 - (dVar14 + (dVar8 - dVar14))) + ((dVar8 - dVar14) - dVar12);
  dVar10 = dVar23 * splitter - (dVar23 * splitter - dVar23);
  dVar11 = dVar25 * splitter - (dVar25 * splitter - dVar25);
  dVar15 = splitter * dVar27 - (splitter * dVar27 - dVar27);
  dVar16 = splitter * dVar31 - (splitter * dVar31 - dVar31);
  dVar12 = dVar23 * dVar27;
  dVar13 = dVar23 * dVar31;
  dVar19 = dVar23 - dVar10;
  dVar20 = dVar27 - dVar15;
  dVar22 = dVar31 - dVar16;
  local_13b8 = dVar19 * dVar20 - (((dVar12 - dVar10 * dVar15) - dVar19 * dVar15) - dVar10 * dVar20);
  dVar32 = dVar25 - dVar11;
  dVar8 = dVar25 * dVar27;
  dVar9 = dVar25 * dVar31;
  dVar33 = dVar32 * dVar20 - (((dVar8 - dVar11 * dVar15) - dVar32 * dVar15) - dVar11 * dVar20);
  dVar34 = dVar32 * dVar22 - (((dVar9 - dVar11 * dVar16) - dVar32 * dVar16) - dVar11 * dVar22);
  dVar20 = dVar12 + dVar33;
  dVar24 = dVar13 + dVar34;
  dVar26 = dVar8 + dVar20;
  dVar29 = dVar20 - (dVar26 - dVar8);
  dVar15 = dVar22 * dVar19 - (((dVar13 - dVar10 * dVar16) - dVar16 * dVar19) - dVar10 * dVar22);
  dVar8 = (dVar12 - (dVar20 - (dVar20 - dVar12))) + (dVar33 - (dVar20 - dVar12));
  dVar12 = (dVar13 - (dVar24 - (dVar24 - dVar13))) + (dVar34 - (dVar24 - dVar13));
  dVar16 = dVar15 + dVar8;
  dVar20 = dVar29 + dVar16;
  dVar22 = (dVar29 - (dVar20 - (dVar20 - dVar29))) + (dVar16 - (dVar20 - dVar29));
  dVar13 = dVar26 + dVar20;
  dVar20 = (dVar26 - (dVar13 - (dVar13 - dVar26))) + (dVar20 - (dVar13 - dVar26));
  dVar26 = dVar12 + dVar22;
  local_13b0 = (dVar15 - (dVar16 - dVar8)) + (dVar8 - (dVar16 - (dVar16 - dVar8)));
  dStack_13a8 = (dVar22 - (dVar26 - (dVar26 - dVar22))) + (dVar12 - (dVar26 - dVar22));
  dVar16 = dVar9 + dVar24;
  dVar15 = dVar20 + dVar26;
  dVar12 = dVar13 + dVar15;
  dVar13 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar15 - (dVar12 - dVar13));
  dVar8 = (dVar9 - (dVar16 - (dVar16 - dVar9))) + (dVar24 - (dVar16 - dVar9));
  dVar9 = (dVar20 - (dVar15 - (dVar15 - dVar20))) + (dVar26 - (dVar15 - dVar20));
  dVar22 = dVar9 + dVar8;
  dVar15 = dVar13 + dVar22;
  dVar13 = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar22 - (dVar15 - dVar13));
  dVar20 = dVar12 + dVar15;
  dVar12 = (dVar12 - (dVar20 - (dVar20 - dVar12))) + (dVar15 - (dVar20 - dVar12));
  dVar15 = dVar13 + dVar16;
  local_13a0 = (dVar9 - (dVar22 - (dVar22 - dVar9))) + (dVar8 - (dVar22 - dVar9));
  dStack_1398 = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar8 = dVar12 + dVar15;
  local_1380 = dVar20 + dVar8;
  local_1390 = (dVar12 - (dVar8 - (dVar8 - dVar12))) + (dVar15 - (dVar8 - dVar12));
  dStack_1388 = (dVar20 - (local_1380 - (local_1380 - dVar20))) + (dVar8 - (local_1380 - dVar20));
  dVar37 = dVar39 * splitter - (dVar39 * splitter - dVar39);
  dVar34 = dVar38 * splitter - (dVar38 * splitter - dVar38);
  dVar22 = -dVar28;
  dVar24 = -dVar17;
  dVar8 = splitter * dVar22 - (dVar28 + splitter * dVar22);
  dVar9 = splitter * dVar24 - (dVar17 + splitter * dVar24);
  dVar35 = dVar39 * dVar22;
  dVar36 = dVar39 * dVar24;
  dVar15 = dVar39 - dVar37;
  dVar12 = dVar22 - dVar8;
  dVar20 = dVar24 - dVar9;
  local_13f8 = dVar15 * dVar12 - (((dVar35 - dVar37 * dVar8) - dVar15 * dVar8) - dVar37 * dVar12);
  dVar33 = dVar38 - dVar34;
  dVar22 = dVar22 * dVar38;
  dVar24 = dVar24 * dVar38;
  dVar13 = dVar33 * dVar12 - (((dVar22 - dVar34 * dVar8) - dVar33 * dVar8) - dVar34 * dVar12);
  dVar16 = dVar33 * dVar20 - (((dVar24 - dVar34 * dVar9) - dVar33 * dVar9) - dVar34 * dVar20);
  dVar26 = dVar35 + dVar13;
  dVar29 = dVar36 + dVar16;
  dVar12 = dVar22 + dVar26;
  dVar8 = dVar26 - (dVar12 - dVar22);
  dVar20 = dVar20 * dVar15 - (((dVar36 - dVar37 * dVar9) - dVar9 * dVar15) - dVar37 * dVar20);
  dVar22 = (dVar35 - (dVar26 - (dVar26 - dVar35))) + (dVar13 - (dVar26 - dVar35));
  dVar26 = (dVar36 - (dVar29 - (dVar29 - dVar36))) + (dVar16 - (dVar29 - dVar36));
  dVar35 = dVar20 + dVar22;
  dVar9 = dVar8 + dVar35;
  dVar13 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar35 - (dVar9 - dVar8));
  dVar8 = dVar12 + dVar9;
  dVar9 = (dVar12 - (dVar8 - (dVar8 - dVar12))) + (dVar9 - (dVar8 - dVar12));
  dVar16 = dVar26 + dVar13;
  local_13f0 = (dVar20 - (dVar35 - dVar22)) + (dVar22 - (dVar35 - (dVar35 - dVar22)));
  dStack_13e8 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar26 - (dVar16 - dVar13));
  dVar20 = dVar24 + dVar29;
  dVar12 = dVar9 + dVar16;
  dVar13 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar13 - (dVar13 - dVar8))) + (dVar12 - (dVar13 - dVar8));
  dVar22 = (dVar24 - (dVar20 - (dVar20 - dVar24))) + (dVar29 - (dVar20 - dVar24));
  dVar24 = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar16 - (dVar12 - dVar9));
  dVar12 = dVar24 + dVar22;
  dVar9 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar12 - (dVar9 - dVar8));
  dVar16 = dVar13 + dVar9;
  dVar13 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar9 - (dVar16 - dVar13));
  dVar9 = dVar8 + dVar20;
  local_13e0 = (dVar24 - (dVar12 - (dVar12 - dVar24))) + (dVar22 - (dVar12 - dVar24));
  dStack_13d8 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar20 - (dVar9 - dVar8));
  dVar8 = dVar13 + dVar9;
  local_13c0 = dVar16 + dVar8;
  local_13d0 = (dVar13 - (dVar8 - (dVar8 - dVar13))) + (dVar9 - (dVar8 - dVar13));
  dStack_13c8 = (dVar16 - (local_13c0 - (local_13c0 - dVar16))) + (dVar8 - (local_13c0 - dVar16));
  dVar8 = splitter * dVar18 - (splitter * dVar18 - dVar18);
  dVar9 = splitter * dVar14 - (splitter * dVar14 - dVar14);
  dVar26 = dVar39 * dVar18;
  dVar39 = dVar39 * dVar14;
  dVar12 = dVar18 - dVar8;
  dVar13 = dVar14 - dVar9;
  local_12f8 = dVar15 * dVar12 - (((dVar26 - dVar37 * dVar8) - dVar15 * dVar8) - dVar37 * dVar12);
  dVar20 = dVar38 * dVar18;
  dVar38 = dVar38 * dVar14;
  dVar22 = dVar33 * dVar12 - (((dVar20 - dVar34 * dVar8) - dVar33 * dVar8) - dVar34 * dVar12);
  dVar24 = dVar33 * dVar13 - (((dVar38 - dVar34 * dVar9) - dVar33 * dVar9) - dVar34 * dVar13);
  dVar8 = dVar26 + dVar22;
  dVar12 = dVar39 + dVar24;
  dVar16 = dVar20 + dVar8;
  dVar20 = dVar8 - (dVar16 - dVar20);
  dVar9 = dVar13 * dVar15 - (((dVar39 - dVar37 * dVar9) - dVar9 * dVar15) - dVar37 * dVar13);
  dVar26 = (dVar26 - (dVar8 - (dVar8 - dVar26))) + (dVar22 - (dVar8 - dVar26));
  dVar24 = (dVar39 - (dVar12 - (dVar12 - dVar39))) + (dVar24 - (dVar12 - dVar39));
  dVar15 = dVar9 + dVar26;
  dVar13 = dVar20 + dVar15;
  dVar20 = (dVar20 - (dVar13 - (dVar13 - dVar20))) + (dVar15 - (dVar13 - dVar20));
  dVar8 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar8 - (dVar8 - dVar16))) + (dVar13 - (dVar8 - dVar16));
  dVar22 = dVar24 + dVar20;
  local_12f0 = (dVar9 - (dVar15 - dVar26)) + (dVar26 - (dVar15 - (dVar15 - dVar26)));
  dStack_12e8 = (dVar20 - (dVar22 - (dVar22 - dVar20))) + (dVar24 - (dVar22 - dVar20));
  dVar15 = dVar38 + dVar12;
  dVar16 = dVar13 + dVar22;
  dVar9 = dVar8 + dVar16;
  dVar8 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar16 - (dVar9 - dVar8));
  dVar20 = (dVar38 - (dVar15 - (dVar15 - dVar38))) + (dVar12 - (dVar15 - dVar38));
  dVar22 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar22 - (dVar16 - dVar13));
  dVar16 = dVar22 + dVar20;
  dVar13 = dVar8 + dVar16;
  dVar8 = (dVar8 - (dVar13 - (dVar13 - dVar8))) + (dVar16 - (dVar13 - dVar8));
  dVar12 = dVar9 + dVar13;
  dVar13 = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar13 - (dVar12 - dVar9));
  dVar9 = dVar8 + dVar15;
  local_12e0 = (dVar22 - (dVar16 - (dVar16 - dVar22))) + (dVar20 - (dVar16 - dVar22));
  dStack_12d8 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar15 - (dVar9 - dVar8));
  dVar8 = dVar13 + dVar9;
  local_12c0 = dVar12 + dVar8;
  local_12d0 = (dVar13 - (dVar8 - (dVar8 - dVar13))) + (dVar9 - (dVar8 - dVar13));
  dStack_12c8 = (dVar12 - (local_12c0 - (local_12c0 - dVar12))) + (dVar8 - (local_12c0 - dVar12));
  dVar8 = dVar30 * dVar28;
  dVar9 = dVar17 * dVar30;
  dVar12 = splitter * dVar30 - (splitter * dVar30 - dVar30);
  dVar36 = splitter * dVar21 - (splitter * dVar21 - dVar21);
  dVar29 = -dVar27;
  dVar33 = -dVar31;
  dVar24 = splitter * dVar29 - (splitter * dVar29 + dVar27);
  dVar26 = splitter * dVar33 - (dVar31 + splitter * dVar33);
  dVar20 = dVar30 * dVar29;
  dVar22 = dVar30 * dVar33;
  dVar30 = dVar30 - dVar12;
  dVar13 = dVar21 * dVar29;
  dVar16 = dVar21 * dVar33;
  dVar29 = dVar29 - dVar24;
  dVar33 = dVar33 - dVar26;
  local_1378 = dVar30 * dVar29 - (((dVar20 - dVar12 * dVar24) - dVar30 * dVar24) - dVar12 * dVar29);
  dVar15 = dVar21 - dVar36;
  dVar34 = dVar15 * dVar29 - (((dVar13 - dVar36 * dVar24) - dVar15 * dVar24) - dVar36 * dVar29);
  dVar35 = dVar15 * dVar33 - (((dVar16 - dVar36 * dVar26) - dVar15 * dVar26) - dVar36 * dVar33);
  dVar24 = dVar20 + dVar34;
  dVar27 = dVar22 + dVar35;
  dVar29 = dVar13 + dVar24;
  dVar31 = dVar24 - (dVar29 - dVar13);
  dVar13 = dVar33 * dVar30 - (((dVar22 - dVar12 * dVar26) - dVar26 * dVar30) - dVar12 * dVar33);
  dVar20 = (dVar20 - (dVar24 - (dVar24 - dVar20))) + (dVar34 - (dVar24 - dVar20));
  dVar22 = (dVar22 - (dVar27 - (dVar27 - dVar22))) + (dVar35 - (dVar27 - dVar22));
  dVar33 = dVar13 + dVar20;
  dVar26 = dVar31 + dVar33;
  dVar31 = (dVar31 - (dVar26 - (dVar26 - dVar31))) + (dVar33 - (dVar26 - dVar31));
  dVar24 = dVar29 + dVar26;
  dVar26 = (dVar29 - (dVar24 - (dVar24 - dVar29))) + (dVar26 - (dVar24 - dVar29));
  dVar34 = dVar22 + dVar31;
  local_1370 = (dVar13 - (dVar33 - dVar20)) + (dVar20 - (dVar33 - (dVar33 - dVar20)));
  dStack_1368 = (dVar31 - (dVar34 - (dVar34 - dVar31))) + (dVar22 - (dVar34 - dVar31));
  dVar29 = dVar16 + dVar27;
  dVar31 = dVar26 + dVar34;
  dVar20 = dVar24 + dVar31;
  dVar22 = (dVar24 - (dVar20 - (dVar20 - dVar24))) + (dVar31 - (dVar20 - dVar24));
  dVar13 = (dVar16 - (dVar29 - (dVar29 - dVar16))) + (dVar27 - (dVar29 - dVar16));
  dVar16 = (dVar26 - (dVar31 - (dVar31 - dVar26))) + (dVar34 - (dVar31 - dVar26));
  dVar27 = dVar16 + dVar13;
  dVar24 = dVar22 + dVar27;
  dVar22 = (dVar22 - (dVar24 - (dVar24 - dVar22))) + (dVar27 - (dVar24 - dVar22));
  dVar26 = dVar20 + dVar24;
  dVar20 = (dVar20 - (dVar26 - (dVar26 - dVar20))) + (dVar24 - (dVar26 - dVar20));
  dVar24 = dVar22 + dVar29;
  local_1360 = (dVar16 - (dVar27 - (dVar27 - dVar16))) + (dVar13 - (dVar27 - dVar16));
  dStack_1358 = (dVar22 - (dVar24 - (dVar24 - dVar22))) + (dVar29 - (dVar24 - dVar22));
  dVar13 = dVar20 + dVar24;
  local_1340 = dVar26 + dVar13;
  local_1350 = (dVar20 - (dVar13 - (dVar13 - dVar20))) + (dVar24 - (dVar13 - dVar20));
  dStack_1348 = (dVar26 - (local_1340 - (local_1340 - dVar26))) + (dVar13 - (local_1340 - dVar26));
  dVar13 = dVar28 * splitter - (dVar28 * splitter - dVar28);
  dVar24 = dVar17 * splitter - (dVar17 * splitter - dVar17);
  dVar26 = dVar21 * dVar28;
  dVar21 = dVar21 * dVar17;
  dVar28 = dVar28 - dVar13;
  dVar17 = dVar17 - dVar24;
  local_1438 = dVar30 * dVar28 - (((dVar8 - dVar12 * dVar13) - dVar30 * dVar13) - dVar12 * dVar28);
  dVar13 = dVar15 * dVar28 - (((dVar26 - dVar36 * dVar13) - dVar15 * dVar13) - dVar36 * dVar28);
  dVar15 = dVar15 * dVar17 - (((dVar21 - dVar36 * dVar24) - dVar15 * dVar24) - dVar36 * dVar17);
  dVar16 = dVar8 + dVar13;
  dVar20 = dVar9 + dVar15;
  dVar22 = dVar26 + dVar16;
  dVar26 = dVar16 - (dVar22 - dVar26);
  dVar17 = dVar17 * dVar30 - (((dVar9 - dVar12 * dVar24) - dVar24 * dVar30) - dVar12 * dVar17);
  dVar8 = (dVar8 - (dVar16 - (dVar16 - dVar8))) + (dVar13 - (dVar16 - dVar8));
  dVar9 = (dVar9 - (dVar20 - (dVar20 - dVar9))) + (dVar15 - (dVar20 - dVar9));
  dVar13 = dVar17 + dVar8;
  dVar16 = dVar26 + dVar13;
  dVar15 = (dVar26 - (dVar16 - (dVar16 - dVar26))) + (dVar13 - (dVar16 - dVar26));
  dVar12 = dVar22 + dVar16;
  dVar16 = (dVar22 - (dVar12 - (dVar12 - dVar22))) + (dVar16 - (dVar12 - dVar22));
  dVar22 = dVar9 + dVar15;
  local_1430 = (dVar17 - (dVar13 - dVar8)) + (dVar8 - (dVar13 - (dVar13 - dVar8)));
  dStack_1428 = (dVar15 - (dVar22 - (dVar22 - dVar15))) + (dVar9 - (dVar22 - dVar15));
  dVar13 = dVar21 + dVar20;
  dVar15 = dVar16 + dVar22;
  dVar8 = dVar12 + dVar15;
  dVar9 = (dVar12 - (dVar8 - (dVar8 - dVar12))) + (dVar15 - (dVar8 - dVar12));
  dVar17 = (dVar21 - (dVar13 - (dVar13 - dVar21))) + (dVar20 - (dVar13 - dVar21));
  dVar20 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar22 - (dVar15 - dVar16));
  dVar16 = dVar20 + dVar17;
  dVar12 = dVar9 + dVar16;
  dVar9 = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar16 - (dVar12 - dVar9));
  dVar15 = dVar8 + dVar12;
  dVar8 = (dVar8 - (dVar15 - (dVar15 - dVar8))) + (dVar12 - (dVar15 - dVar8));
  dVar12 = dVar9 + dVar13;
  local_1420 = (dVar20 - (dVar16 - (dVar16 - dVar20))) + (dVar17 - (dVar16 - dVar20));
  dStack_1418 = (dVar9 - (dVar12 - (dVar12 - dVar9))) + (dVar13 - (dVar12 - dVar9));
  dVar9 = dVar8 + dVar12;
  local_1400 = dVar15 + dVar9;
  local_1410 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar12 - (dVar9 - dVar8));
  dStack_1408 = (dVar15 - (local_1400 - (local_1400 - dVar15))) + (dVar9 - (local_1400 - dVar15));
  dVar9 = -dVar18;
  dVar20 = -dVar14;
  dVar8 = splitter * dVar9 - (splitter * dVar9 + dVar18);
  dVar13 = splitter * dVar20 - (dVar14 + splitter * dVar20);
  dVar17 = dVar23 * dVar9;
  dVar23 = dVar23 * dVar20;
  dVar14 = dVar25 * dVar9;
  dVar25 = dVar25 * dVar20;
  dVar9 = dVar9 - dVar8;
  dVar20 = dVar20 - dVar13;
  local_1338 = dVar19 * dVar9 - (((dVar17 - dVar10 * dVar8) - dVar19 * dVar8) - dVar10 * dVar9);
  dVar15 = dVar32 * dVar9 - (((dVar14 - dVar11 * dVar8) - dVar32 * dVar8) - dVar11 * dVar9);
  dVar16 = dVar32 * dVar20 - (((dVar25 - dVar11 * dVar13) - dVar32 * dVar13) - dVar11 * dVar20);
  dVar9 = dVar17 + dVar15;
  dVar11 = dVar23 + dVar16;
  dVar12 = dVar14 + dVar9;
  dVar8 = dVar9 - (dVar12 - dVar14);
  dVar14 = dVar20 * dVar19 - (((dVar23 - dVar10 * dVar13) - dVar13 * dVar19) - dVar10 * dVar20);
  dVar17 = (dVar17 - (dVar9 - (dVar9 - dVar17))) + (dVar15 - (dVar9 - dVar17));
  dVar16 = (dVar23 - (dVar11 - (dVar11 - dVar23))) + (dVar16 - (dVar11 - dVar23));
  dVar10 = dVar14 + dVar17;
  dVar9 = dVar8 + dVar10;
  dVar13 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar10 - (dVar9 - dVar8));
  dVar8 = dVar12 + dVar9;
  dVar9 = (dVar12 - (dVar8 - (dVar8 - dVar12))) + (dVar9 - (dVar8 - dVar12));
  dVar15 = dVar16 + dVar13;
  local_1330 = (dVar14 - (dVar10 - dVar17)) + (dVar17 - (dVar10 - (dVar10 - dVar17)));
  dStack_1328 = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dVar25 + dVar11;
  dVar10 = dVar9 + dVar15;
  dVar12 = dVar8 + dVar10;
  dVar8 = (dVar8 - (dVar12 - (dVar12 - dVar8))) + (dVar10 - (dVar12 - dVar8));
  dVar16 = (dVar25 - (dVar13 - (dVar13 - dVar25))) + (dVar11 - (dVar13 - dVar25));
  dVar15 = (dVar9 - (dVar10 - (dVar10 - dVar9))) + (dVar15 - (dVar10 - dVar9));
  dVar14 = dVar15 + dVar16;
  dVar9 = dVar8 + dVar14;
  dVar8 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar14 - (dVar9 - dVar8));
  dVar10 = dVar12 + dVar9;
  dVar11 = (dVar12 - (dVar10 - (dVar10 - dVar12))) + (dVar9 - (dVar10 - dVar12));
  dVar9 = dVar8 + dVar13;
  local_1320 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar16 - (dVar14 - dVar15));
  dStack_1318 = (dVar8 - (dVar9 - (dVar9 - dVar8))) + (dVar13 - (dVar9 - dVar8));
  dVar8 = dVar11 + dVar9;
  local_1300 = dVar10 + dVar8;
  local_1310 = (dVar11 - (dVar8 - (dVar8 - dVar11))) + (dVar9 - (dVar8 - dVar11));
  dStack_1308 = (dVar10 - (local_1300 - (local_1300 - dVar10))) + (dVar8 - (local_1300 - dVar10));
  iVar5 = fast_expansion_sum_zeroelim(8,&local_12f8,8,&local_1378,local_12b8);
  iVar6 = scale_expansion_zeroelim(iVar5,local_12b8,b,local_d38);
  iVar5 = scale_expansion_zeroelim
                    (iVar5,local_12b8,(dVar1 - (b + (dVar1 - b))) + ((dVar1 - b) - dVar2),local_e38)
  ;
  iVar5 = fast_expansion_sum_zeroelim(iVar6,local_d38,iVar5,local_e38,local_1038);
  iVar6 = fast_expansion_sum_zeroelim(8,&local_1438,8,&local_1338,local_12b8);
  iVar7 = scale_expansion_zeroelim(iVar6,local_12b8,b_00,local_d38);
  iVar6 = scale_expansion_zeroelim
                    (iVar6,local_12b8,(dVar3 - (b_00 + (dVar3 - b_00))) + ((dVar3 - b_00) - dVar2),
                     local_e38);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,local_d38,iVar6,local_e38,local_1238);
  iVar7 = fast_expansion_sum_zeroelim(8,&local_13b8,8,&local_13f8,local_12b8);
  elen = scale_expansion_zeroelim(iVar7,local_12b8,b_01,local_d38);
  iVar7 = scale_expansion_zeroelim
                    (iVar7,local_12b8,(dVar4 - (b_01 + (dVar4 - b_01))) + ((dVar4 - b_01) - dVar2),
                     local_e38);
  iVar7 = fast_expansion_sum_zeroelim(elen,local_d38,iVar7,local_e38,local_c38);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_1038,iVar6,local_1238,local_438);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_438,iVar7,local_c38,adStack_a40 + 1);
  return adStack_a40[iVar5];
}

Assistant:

REAL orient3dslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL adx, ady, adz, bdx, bdy, bdz, cdx, cdy, cdz;
  REAL adxtail, adytail, adztail;
  REAL bdxtail, bdytail, bdztail;
  REAL cdxtail, cdytail, cdztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16], temp32[32], temp32t[32];
  int temp16len, temp32len, temp32tlen;
  REAL adet[64], bdet[64], cdet[64];
  int alen, blen, clen;
  REAL abdet[128];
  int ablen;
  REAL deter[192];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pa[2], pd[2], adz, adztail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pb[2], pd[2], bdz, bdztail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);
  Two_Diff(pc[2], pd[2], cdz, cdztail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;

  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, adz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, adztail, temp32t);
  alen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     adet);

  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, bdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, bdztail, temp32t);
  blen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     bdet);

  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, cdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, cdztail, temp32t);
  clen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}